

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O0

size_t pack_duration(char **buf,DurationMsg *cmsg)

{
  size_t len;
  char *ptr;
  DurationMsg *cmsg_local;
  char **buf_local;
  
  ptr = (char *)cmsg;
  cmsg_local = (DurationMsg *)buf;
  len = (size_t)emalloc(8);
  *(size_t *)cmsg_local = len;
  pack_type((char **)&len,CK_MSG_DURATION);
  if (0xffffffff < (ulong)(long)*(int *)ptr) {
    eprintf("Value of cmsg->duration (%d) too big to pack, max allowed %u\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_pack.c"
            ,0x11a,(ulong)*(uint *)ptr,0xffffffff);
  }
  pack_int((char **)&len,*(ck_uint32 *)ptr);
  return 8;
}

Assistant:

static size_t pack_duration(char **buf, DurationMsg * cmsg)
{
    char *ptr;
    size_t len;

    len = 4 + 4;
    *buf = ptr = (char *)emalloc(len);

    pack_type(&ptr, CK_MSG_DURATION);
    if((size_t) cmsg->duration > (size_t) CK_UINT32_MAX)
        eprintf("Value of cmsg->duration (%d) too big to pack, max allowed %u\n",
                __FILE__, __LINE__, cmsg->duration, CK_UINT32_MAX);
    pack_int(&ptr, (ck_uint32) cmsg->duration);

    return len;
}